

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator=
          (SpatialRigidBodyInertia *this,SpatialRigidBodyInertia *param_1)

{
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  Scalar SVar5;
  
  this->m = param_1->m;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&(this->h).super_Vector3d,&(param_1->h).super_Vector3d);
  SVar1 = param_1->Ixx;
  SVar2 = param_1->Iyx;
  SVar3 = param_1->Iyy;
  SVar4 = param_1->Izx;
  SVar5 = param_1->Izz;
  this->Izy = param_1->Izy;
  this->Izz = SVar5;
  this->Iyy = SVar3;
  this->Izx = SVar4;
  this->Ixx = SVar1;
  this->Iyx = SVar2;
  return this;
}

Assistant:

struct RBDL_DLLAPI SpatialRigidBodyInertia {
  SpatialRigidBodyInertia() :
    m (0.),
    h (Vector3d::Zero()),
    Ixx (0.), Iyx(0.), Iyy(0.), Izx(0.), Izy(0.), Izz(0.)
  {}
  SpatialRigidBodyInertia (
      Scalar mass, const Vector3d &com_mass, const Matrix3d &inertia) :
    m (mass), h (com_mass),
    Ixx (inertia(0,0)),
    Iyx (inertia(1,0)), Iyy(inertia(1,1)),
    Izx (inertia(2,0)), Izy(inertia(2,1)), Izz(inertia(2,2))
  { }
  SpatialRigidBodyInertia (Scalar m, const Vector3d &h,
      const Scalar &Ixx,
      const Scalar &Iyx, const Scalar &Iyy,
      const Scalar &Izx, const Scalar &Izy, const Scalar &Izz
      ) :
    m (m), h (h),
    Ixx (Ixx),
    Iyx (Iyx), Iyy(Iyy),
    Izx (Izx), Izy(Izy), Izz(Izz)
  { }

  SpatialVector operator* (const SpatialVector &mv) {
    Vector3d mv_lower (mv[3], mv[4], mv[5]);

    Vector3d res_upper = Vector3d (
        Ixx * mv[0] + Iyx * mv[1] + Izx * mv[2],
        Iyx * mv[0] + Iyy * mv[1] + Izy * mv[2],
        Izx * mv[0] + Izy * mv[1] + Izz * mv[2]
        ) + h.cross(mv_lower);
    Vector3d res_lower = m * mv_lower - h.cross (Vector3d (mv[0], mv[1], mv[2]));

    return SpatialVector (
        res_upper[0], res_upper[1], res_upper[2],
        res_lower[0], res_lower[1], res_lower[2]
        );
  }

  SpatialRigidBodyInertia operator+ (const SpatialRigidBodyInertia &rbi) {
    return SpatialRigidBodyInertia (
        m + rbi.m,
        h + rbi.h,
        Ixx + rbi.Ixx,
        Iyx + rbi.Iyx, Iyy + rbi.Iyy,
        Izx + rbi.Izx, Izy + rbi.Izy, Izz + rbi.Izz
        );
  }

  void createFromMatrix (const SpatialMatrix &Ic) {
    m = Ic(3,3);
    h.set (-Ic(1,5), Ic(0,5), -Ic(0,4));
    Ixx = Ic(0,0);
    Iyx = Ic(1,0); Iyy = Ic(1,1);
    Izx = Ic(2,0); Izy = Ic(2,1); Izz = Ic(2,2);
  }

  SpatialMatrix toMatrix() const {
    SpatialMatrix result;
    result(0,0) = Ixx; result(0,1) = Iyx; result(0,2) = Izx;
    result(1,0) = Iyx; result(1,1) = Iyy; result(1,2) = Izy;
    result(2,0) = Izx; result(2,1) = Izy; result(2,2) = Izz;

    result.block<3,3>(0,3) = VectorCrossMatrix(h);
    result.block<3,3>(3,0) = - VectorCrossMatrix(h);
    result.block<3,3>(3,3) = Matrix3d::Identity() * m;

    return result;
  }

  void setSpatialMatrix (SpatialMatrix &mat) const {
    mat(0,0) = Ixx; mat(0,1) = Iyx; mat(0,2) = Izx;
    mat(1,0) = Iyx; mat(1,1) = Iyy; mat(1,2) = Izy;
    mat(2,0) = Izx; mat(2,1) = Izy; mat(2,2) = Izz;

    mat(3,0) =    0.; mat(3,1) =  h[2]; mat(3,2) = -h[1];
    mat(4,0) = -h[2]; mat(4,1) =    0.; mat(4,2) =  h[0];
    mat(5,0) =  h[1]; mat(5,1) = -h[0]; mat(5,2) =    0.;

    mat(0,3) =    0.; mat(0,4) = -h[2]; mat(0,5) =  h[1];
    mat(1,3) =  h[2]; mat(1,4) =    0.; mat(1,5) = -h[0];
    mat(2,3) = -h[1]; mat(2,4) =  h[0]; mat(2,5) =    0.;

    mat(3,3) =     m; mat(3,4) =    0.; mat(3,5) =    0.;
    mat(4,3) =    0.; mat(4,4) =     m; mat(4,5) =    0.; 
    mat(5,3) =    0.; mat(5,4) =    0.; mat(5,5) =     m;
  }

  static SpatialRigidBodyInertia createFromMassComInertiaC (Scalar mass, const Vector3d &com, const Matrix3d &inertia_C) {
    SpatialRigidBodyInertia result;
    result.m = mass;
    result.h = com * mass;
    Matrix3d I = inertia_C + VectorCrossMatrix (com) * VectorCrossMatrix(com).transpose() * mass;
    result.Ixx = I(0,0);
    result.Iyx = I(1,0);
    result.Iyy = I(1,1);
    result.Izx = I(2,0);
    result.Izy = I(2,1);
    result.Izz = I(2,2);
    return result;
  }

  /// Mass
  Scalar m;
  /// Coordinates of the center of mass
  Vector3d h;
  /// Inertia expressed at the origin
  Scalar Ixx, Iyx, Iyy, Izx, Izy, Izz;
}